

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void LiteScript::StateExecutor::I_VALUE_ARGS(State *state,Instruction *instr)

{
  Array *this;
  void *pvVar1;
  uint uVar2;
  Object *pOVar3;
  uint uVar4;
  undefined1 local_60 [48];
  
  state->line_num = state->line_num + 1;
  if (instr->comp_type == '\x02') {
    Memory::Create((Memory *)local_60,(Type *)state->memory);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
    emplace_back<LiteScript::Variable>(&state->op_lifo,(Variable *)local_60);
    Variable::~Variable((Variable *)local_60);
    pOVar3 = Variable::operator->
                       ((state->op_lifo).
                        super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1);
    pvVar1 = pOVar3->data;
    uVar4 = (instr->comp_value).v_integer;
    uVar2 = State::GetArgsCount(state);
    this = (Array *)(local_60 + 0x10);
    for (; uVar4 < uVar2; uVar4 = uVar4 + 1) {
      State::GetArg((State *)local_60,(uint)state);
      Array::operator[](this,(uint)pvVar1);
      Variable::operator=((Variable *)(local_60 + 0x20),(Variable *)this);
      Variable::~Variable((Variable *)(local_60 + 0x20));
      Variable::~Variable((Variable *)this);
      Variable::~Variable((Variable *)local_60);
    }
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_VALUE_ARGS(State& state, Instruction& instr) {
    state.line_num++;
    if (instr.comp_type != Instruction::CompType::COMP_TYPE_INTEGER)
        return;
    state.op_lifo.push_back(state.memory.Create(Type::ARRAY));
    Array& a = state.op_lifo.back()->GetData<Array>();
    for (unsigned int i = (unsigned int)instr.comp_value.v_integer, sz = state.GetArgsCount(); i < sz; i++)
        a[i] = state.GetArg(i);
}